

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

Result<void> * __thiscall
node::anon_unknown_2::ChainImpl::checkChainLimits
          (Result<void> *__return_storage_ptr__,ChainImpl *this,CTransactionRef *tx)

{
  long lVar1;
  CTxMemPool *this_00;
  int32_t iVar2;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  allocator_type local_1a1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_1a0;
  undefined4 local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_160;
  CTxMemPoolEntry entry;
  uint uStack_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_node->mempool)._M_t.
      super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
  else {
    local_188 = 0;
    uStack_180 = 0;
    uStack_17c = 0;
    uStack_178 = 0;
    uStack_174 = 0;
    CTxMemPoolEntry::CTxMemPoolEntry
              (&entry,tx,0,0,0,0,false,0,(LockPoints)(ZEXT424(uStack_3c) << 0x20));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock39,
               &((this->m_node->mempool)._M_t.
                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                 super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs,"m_node.mempool->cs",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
               ,0x2da,false);
    this_00 = (this->m_node->mempool)._M_t.
              super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
              super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
              super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_160,&tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_160;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector(&local_1a0,__l,&local_1a1);
    iVar2 = CTxMemPoolEntry::GetTxSize(&entry);
    CTxMemPool::CheckPackageLimits(__return_storage_ptr__,this_00,&local_1a0,(long)iVar2);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_1a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock39.super_unique_lock);
    CTxMemPoolEntry::~CTxMemPoolEntry(&entry);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> checkChainLimits(const CTransactionRef& tx) override
    {
        if (!m_node.mempool) return {};
        LockPoints lp;
        CTxMemPoolEntry entry(tx, 0, 0, 0, 0, false, 0, lp);
        LOCK(m_node.mempool->cs);
        return m_node.mempool->CheckPackageLimits({tx}, entry.GetTxSize());
    }